

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffx.c
# Opt level: O1

void ptls_ffx_one_pass(ptls_cipher_context_t *enc_ctx,uint8_t *source,size_t source_size,
                      uint8_t *target,size_t target_size,uint8_t mask_last_byte,uint8_t *confusion,
                      uint8_t *iv,uint8_t *tweaks,uint8_t round,uint8_t nb_rounds)

{
  undefined8 uVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  
  uVar1 = *(undefined8 *)(tweaks + 8);
  *(undefined8 *)iv = *(undefined8 *)tweaks;
  *(undefined8 *)(iv + 8) = uVar1;
  iv[round & 0xf] = iv[round & 0xf] ^ nb_rounds;
  if (source_size != 0) {
    sVar3 = 0;
    do {
      iv[sVar3] = iv[sVar3] ^ source[sVar3];
      sVar3 = sVar3 + 1;
    } while (source_size != sVar3);
  }
  (*enc_ctx->do_init)(enc_ctx,iv);
  (*enc_ctx->do_transform)(enc_ctx,confusion,"",0x10);
  lVar4 = target_size - 1;
  if (lVar4 != 0) {
    lVar2 = 0;
    do {
      target[lVar2] = target[lVar2] ^ confusion[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar4 != lVar2);
  }
  target[lVar4] = target[lVar4] ^ mask_last_byte & confusion[lVar4];
  return;
}

Assistant:

static void ptls_ffx_one_pass(ptls_cipher_context_t *enc_ctx, uint8_t *source, size_t source_size, uint8_t *target,
                              size_t target_size, uint8_t mask_last_byte, uint8_t *confusion, uint8_t *iv, uint8_t *tweaks,
                              uint8_t round, uint8_t nb_rounds)
{
    static const uint8_t zeros[16] = {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0};

    memcpy(iv, tweaks, 16);
    iv[round & 15] ^= nb_rounds;
    for (size_t i = 0; i < source_size; i++) {
        iv[i] ^= source[i];
    }
    ptls_cipher_init(enc_ctx, iv);
    ptls_cipher_encrypt(enc_ctx, confusion, zeros, 16);
    for (size_t j = 0; j < target_size - 1; j++) {
        target[j] ^= confusion[j];
    }
    target[target_size - 1] ^= (confusion[target_size - 1] & mask_last_byte);
}